

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O0

string * __thiscall
upb::generator::MiniTableFieldsVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view msg_full_name)

{
  string local_40;
  generator *pgStack_20;
  string_view msg_full_name_local;
  
  msg_full_name_local._M_len = msg_full_name._M_len;
  pgStack_20 = this;
  msg_full_name_local._M_str = (char *)__return_storage_ptr__;
  (anonymous_namespace)::ToCIdent_abi_cxx11_(&local_40,(_anonymous_namespace_ *)this,msg_full_name);
  std::operator+(__return_storage_ptr__,&local_40,"__fields");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableFieldsVarName(absl::string_view msg_full_name) {
  return ToCIdent(msg_full_name) + "__fields";
}